

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O0

REF_STATUS collar(REF_MPI ref_mpi,int argc,char **argv)

{
  double dVar1;
  char *pcVar2;
  char *filename;
  char *family_name_00;
  REF_NODE pRVar3;
  bool bVar4;
  REF_DBL RVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rxs_4;
  REF_DBL z;
  REF_DBL x;
  REF_INT node;
  REF_NODE ref_node;
  REF_DBL rotate_rad;
  REF_DBL rotate_deg;
  REF_STATUS ref_private_macro_code_rxs_3;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_INT bc_type;
  char *family_name;
  char *mapbc_1;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rss_2;
  char *mapbc;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs;
  REF_BOOL default_export_filename;
  REF_BOOL on_rails;
  REF_BOOL extrude_radially;
  REF_BOOL debug;
  REF_DBL origin [3];
  REF_INT opt;
  REF_INT pos;
  REF_DICT faceids;
  REF_DBL rate;
  REF_DBL xshift;
  REF_DBL total;
  REF_DBL thickness;
  REF_DBL alpha_rad;
  REF_DBL mach_angle_rad;
  REF_DBL mach;
  REF_DBL total_thickness;
  REF_DBL first_thickness;
  REF_INT layer;
  REF_INT nlayers;
  REF_GRID_conflict ref_grid;
  char *inflate_method;
  undefined2 local_47;
  undefined1 local_45;
  undefined1 uStack_44;
  char inflate_radial [7];
  char inflate_flat [5];
  char inflate_normal [7];
  char *inflate_arg;
  char *input_filename;
  char **argv_local;
  int argc_local;
  REF_MPI ref_mpi_local;
  
  stack0xffffffffffffffc1 = 0x6d726f6e;
  _uStack_44 = 0x74616c66;
  inflate_radial[3] = '\0';
  stack0xffffffffffffffb5 = 0x69646172;
  local_47 = 0x6c61;
  local_45 = 0;
  ref_grid = (REF_GRID_conflict)0x0;
  _layer = (REF_GRID)0x0;
  thickness = 0.0;
  on_rails = 0;
  bVar8 = false;
  ref_private_macro_code_rxs = 0;
  bVar4 = true;
  origin[2]._4_4_ = -1;
  uVar6 = ref_args_find(argc,argv,"--debug",(REF_INT *)((long)origin + 0x14));
  if ((uVar6 != 0) && (uVar6 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x699,"collar",(ulong)uVar6,"debug search");
    return uVar6;
  }
  if ((origin[2]._4_4_ != -1) && (on_rails = 1, ref_mpi->id == 0)) {
    printf(" --debug %d\n",1);
  }
  if (argc < 8) {
    if (ref_mpi->id == 0) {
      printf("not enough required arguments\n");
    }
  }
  else {
    pcVar2 = argv[2];
    filename = argv[3];
    first_thickness._4_4_ = atoi(argv[4]);
    total_thickness = atof(argv[5]);
    mach = atof(argv[6]);
    mach_angle_rad = atof(argv[7]);
    ref_grid = (REF_GRID_conflict)0x0;
    iVar7 = strncmp(pcVar2,"n",1);
    if (iVar7 == 0) {
      ref_grid = (REF_GRID_conflict)(inflate_radial + 4);
    }
    else {
      iVar7 = strncmp(pcVar2,"f",1);
      if (iVar7 == 0) {
        ref_grid = (REF_GRID_conflict)&uStack_44;
        bVar8 = true;
        ref_private_macro_code_rxs = 1;
      }
      else {
        iVar7 = strncmp(pcVar2,"r",1);
        bVar8 = iVar7 == 0;
        if (bVar8) {
          ref_grid = (REF_GRID_conflict)((long)&inflate_method + 5);
        }
      }
    }
    if (ref_grid == (REF_GRID_conflict)0x0) {
      if (ref_mpi->id == 0) {
        printf("unable to parse inflate method >%s<\n",pcVar2);
      }
    }
    else {
      if (ref_mpi->id == 0) {
        printf("inflation method %s\n",ref_grid);
        printf("number of layers %d\n",(ulong)first_thickness._4_4_);
        printf("first thickness %f\n",total_thickness);
        printf("total thickness %f\n",mach);
        printf("mach %f\n",mach_angle_rad);
      }
      if (((((int)first_thickness._4_4_ < 1) || (total_thickness <= 0.0)) || (mach <= 0.0)) ||
         (mach_angle_rad <= 1.0)) {
        if (ref_mpi->id == 0) {
          printf("number of layers and thicknesses must be positive and Mach supersonic\n");
        }
      }
      else {
        alpha_rad = asin(1.0 / mach_angle_rad);
        uVar6 = ref_inflate_rate(first_thickness._4_4_,total_thickness,mach,(REF_DBL *)&faceids);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x6d1,"collar",(ulong)uVar6,"compute rate");
          return uVar6;
        }
        if (ref_mpi->id == 0) {
          printf("layer growth rate %f\n",faceids);
          printf("mach angle %f rad %f deg\n",alpha_rad,(alpha_rad * 180.0) / 3.14159265358979);
        }
        uVar6 = ref_dict_create((REF_DICT *)&opt);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x6d9,"collar",(ulong)uVar6,"create");
          return uVar6;
        }
        uVar6 = ref_args_find(argc,argv,"--fun3d-mapbc",(REF_INT *)((long)origin + 0x14));
        if ((uVar6 != 0) && (uVar6 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x6dc,"collar",(ulong)uVar6,"arg search");
          return uVar6;
        }
        if (origin[2]._4_4_ != -1) {
          if (argc + -1 <= origin[2]._4_4_) {
            if (ref_mpi->id == 0) {
              printf("--fun3d-mapbc requires a filename\n");
            }
            goto LAB_0011741f;
          }
          pcVar2 = argv[origin[2]._4_4_ + 1];
          if (ref_mpi->id == 0) {
            printf("reading fun3d bc map %s\n",pcVar2);
            uVar6 = ref_phys_read_mapbc_token(_opt,pcVar2,"inflate");
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x6e9,"collar",(ulong)uVar6,"unable to read fun3d formatted mapbc");
              return uVar6;
            }
          }
        }
        uVar6 = ref_args_find(argc,argv,"--usm3d-mapbc",(REF_INT *)((long)origin + 0x14));
        if ((uVar6 != 0) && (uVar6 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x6ee,"collar",(ulong)uVar6,"arg search");
          return uVar6;
        }
        if (origin[2]._4_4_ != -1) {
          if (argc + -3 <= origin[2]._4_4_) {
            if (ref_mpi->id == 0) {
              printf("--usm3d-mapbc requires a filename, family, and bc type\n");
            }
            goto LAB_0011741f;
          }
          pcVar2 = argv[origin[2]._4_4_ + 1];
          family_name_00 = argv[origin[2]._4_4_ + 2];
          uVar6 = atoi(argv[origin[2]._4_4_ + 3]);
          if (ref_mpi->id == 0) {
            printf("reading usm3d bc map %s family %s bc %d\n",pcVar2,family_name_00,(ulong)uVar6);
            uVar6 = ref_inflate_read_usm3d_mapbc(_opt,pcVar2,family_name_00,uVar6);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x700,"collar",(ulong)uVar6,"faceids from mapbc");
              return uVar6;
            }
          }
        }
        uVar6 = ref_dict_bcast(_opt,ref_mpi);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x704,"collar",(ulong)uVar6,"bcast");
          return uVar6;
        }
        if (ref_mpi->id == 0) {
          printf("inflating %d faces\n",(ulong)(uint)_opt->n);
        }
        if (0 < _opt->n) {
          ref_mpi_stopwatch_start(ref_mpi);
          if (ref_mpi->n < 2) {
            if (ref_mpi->id == 0) {
              printf("import %s\n",filename);
            }
            uVar6 = ref_import_by_extension((REF_GRID *)&layer,ref_mpi,filename);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x71b,"collar",(ulong)uVar6,"import");
              return uVar6;
            }
            ref_mpi_stopwatch_stop(ref_mpi,"core import");
          }
          else {
            if (ref_mpi->id == 0) {
              printf("part %s\n",filename);
            }
            uVar6 = ref_part_by_extension((REF_GRID *)&layer,ref_mpi,filename);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x713,"collar",(ulong)uVar6,"part");
              return uVar6;
            }
            ref_mpi_stopwatch_stop(ref_mpi,"core part");
            uVar6 = ref_migrate_to_balance(_layer);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x715,"collar",(ulong)uVar6,"balance");
              return uVar6;
            }
            ref_mpi_stopwatch_stop(ref_mpi,"balance core");
            uVar6 = ref_grid_pack(_layer);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x717,"collar",(ulong)uVar6,"pack");
              return uVar6;
            }
            ref_mpi_stopwatch_stop(ref_mpi,"pack core");
          }
          if (ref_mpi->id == 0) {
            printf("  read %ld vertices\n",_layer->node->old_n_global);
          }
          uVar6 = ref_args_find(argc,argv,"--rotate",(REF_INT *)((long)origin + 0x14));
          if ((uVar6 != 0) && (uVar6 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x723,"collar",(ulong)uVar6,"rotate search");
            return uVar6;
          }
          if (origin[2]._4_4_ != -1) {
            pRVar3 = _layer->node;
            if (argc + -1 <= origin[2]._4_4_) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x729,"collar","--rotate requires a value");
              return 1;
            }
            dVar9 = atof(argv[origin[2]._4_4_ + 1]);
            dVar10 = (dVar9 / 180.0) * 3.14159265358979;
            if (ref_mpi->id == 0) {
              printf(" --rotate %f deg (%f rad)\n",dVar9,dVar10);
            }
            for (x._4_4_ = 0; x._4_4_ < pRVar3->max; x._4_4_ = x._4_4_ + 1) {
              if (((-1 < x._4_4_) && (x._4_4_ < pRVar3->max)) && (-1 < pRVar3->global[x._4_4_])) {
                dVar9 = pRVar3->real[x._4_4_ * 0xf];
                dVar1 = pRVar3->real[x._4_4_ * 0xf + 2];
                dVar11 = cos(dVar10);
                dVar12 = sin(dVar10);
                pRVar3->real[x._4_4_ * 0xf] = dVar9 * dVar11 + -(dVar1 * dVar12);
                dVar11 = sin(dVar10);
                dVar12 = cos(dVar10);
                pRVar3->real[x._4_4_ * 0xf + 2] = dVar9 * dVar11 + dVar1 * dVar12;
              }
            }
          }
          uVar6 = ref_args_find(argc,argv,"--origin",(REF_INT *)((long)origin + 0x14));
          if ((uVar6 != 0) && (uVar6 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x73a,"collar",(ulong)uVar6,"origin search");
            return uVar6;
          }
          if (origin[2]._4_4_ == -1) {
            uVar6 = ref_inflate_origin(_layer,_opt,(REF_DBL *)&extrude_radially);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x744,"collar",(ulong)uVar6,"orig");
              return uVar6;
            }
            if (ref_mpi->id == 0) {
              printf(" --origin %f %f %f inferred from z-midpoint\n",_extrude_radially,origin[0],
                     origin[1]);
            }
          }
          else {
            if (argc + -3 <= origin[2]._4_4_) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x73c,"collar","--origin requires three values");
              return 1;
            }
            _extrude_radially = atof(argv[origin[2]._4_4_ + 1]);
            origin[0] = atof(argv[origin[2]._4_4_ + 2]);
            origin[1] = atof(argv[origin[2]._4_4_ + 3]);
            if (ref_mpi->id == 0) {
              printf(" --origin %f %f %f from argument\n",_extrude_radially,origin[0],origin[1]);
            }
          }
          if (on_rails != 0) {
            uVar6 = ref_gather_tec_movie_record_button(_layer->gather,1);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x74c,"collar",(ulong)uVar6,"movie on");
              return uVar6;
            }
            uVar6 = ref_gather_tec_movie_frame(_layer,"core");
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x74d,"collar",(ulong)uVar6,"movie frame");
              return uVar6;
            }
          }
          xshift = 0.0;
          for (first_thickness._0_4_ = 0; RVar5 = total_thickness,
              first_thickness._0_4_ < (int)first_thickness._4_4_;
              first_thickness._0_4_ = first_thickness._0_4_ + 1) {
            dVar9 = pow((double)faceids,(double)first_thickness._0_4_);
            dVar9 = RVar5 * dVar9;
            xshift = xshift + dVar9;
            total = dVar9;
            dVar10 = tan(alpha_rad);
            rate = dVar9 / dVar10;
            if (bVar8) {
              uVar6 = ref_inflate_radially
                                (_layer,_opt,(REF_DBL *)&extrude_radially,total,alpha_rad,thickness,
                                 ref_private_macro_code_rxs,on_rails);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                       ,0x759,"collar",(ulong)uVar6,"inflate");
                return uVar6;
              }
            }
            else {
              uVar6 = ref_inflate_face(_layer,_opt,(REF_DBL *)&extrude_radially,total,rate);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                       ,0x75c,"collar",(ulong)uVar6,"inflate");
                return uVar6;
              }
            }
            if (ref_mpi->id == 0) {
              printf("layer%5d of%5d thickness %10.3e total %10.3e %ld nodes\n",total,xshift,
                     (ulong)(first_thickness._0_4_ + 1),(ulong)first_thickness._4_4_,
                     _layer->node->old_n_global);
            }
          }
          ref_mpi_stopwatch_stop(_layer->mpi,"inflate");
          if (ref_mpi->id == 0) {
            printf("inflated %d faces\n",(ulong)(uint)_opt->n);
            printf("mach %f mach angle %f rad %f deg\n",mach_angle_rad,alpha_rad,
                   (alpha_rad * 180.0) / 3.14159265358979);
            printf("first thickness %f\n",total_thickness);
            printf("total thickness %f\n",mach);
            printf("rate %f\n",faceids);
            printf("layers %d\n",(ulong)first_thickness._4_4_);
            printf("inflate method %s\n",ref_grid);
          }
          for (origin[2]._0_4_ = 0; origin[2]._0_4_ < argc + -1;
              origin[2]._0_4_ = origin[2]._0_4_ + 1) {
            iVar7 = strcmp(argv[origin[2]._0_4_],"-x");
            if (iVar7 == 0) {
              bVar4 = false;
              if (ref_mpi->n < 2) {
                if (ref_mpi->id == 0) {
                  printf("export %ld nodes to %s\n",_layer->node->old_n_global,
                         argv[origin[2]._0_4_ + 1]);
                }
                uVar6 = ref_export_by_extension(_layer,argv[origin[2]._0_4_ + 1]);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                         ,0x781,"collar",(ulong)uVar6,"export -x");
                  return uVar6;
                }
                ref_mpi_stopwatch_stop(_layer->mpi,"export");
              }
              else {
                if (ref_mpi->id == 0) {
                  printf("gather %ld nodes to %s\n",_layer->node->old_n_global,
                         argv[origin[2]._0_4_ + 1]);
                }
                uVar6 = ref_gather_by_extension(_layer,argv[origin[2]._0_4_ + 1]);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                         ,0x77b,"collar",(ulong)uVar6,"gather -x");
                  return uVar6;
                }
                ref_mpi_stopwatch_stop(_layer->mpi,"gather");
              }
            }
          }
          if (bVar4) {
            if (ref_mpi->id == 0) {
              printf("gather %ld nodes to %s\n",_layer->node->old_n_global,"inflated.b8.ugrid");
            }
            uVar6 = ref_gather_by_extension(_layer,"inflated.b8.ugrid");
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x78b,"collar",(ulong)uVar6,"gather");
              return uVar6;
            }
            ref_mpi_stopwatch_stop(_layer->mpi,"gather");
          }
          uVar6 = ref_dict_free(_opt);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x78f,"collar",(ulong)uVar6,"free");
            return uVar6;
          }
          uVar6 = ref_grid_free(_layer);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x790,"collar",(ulong)uVar6,"grid");
            return uVar6;
          }
          return 0;
        }
        if (ref_mpi->id == 0) {
          printf("no faces to inflate, use --fun3d-mapbc or --usm3d-mapbc\n");
        }
      }
    }
  }
LAB_0011741f:
  if (ref_mpi->id == 0) {
    collar_help(*argv);
  }
  ref_mpi_local._4_4_ = ref_grid_free(_layer);
  if (ref_mpi_local._4_4_ == 0) {
    ref_mpi_local._4_4_ = 1;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x795,"collar",(ulong)ref_mpi_local._4_4_,"grid");
  }
  return ref_mpi_local._4_4_;
}

Assistant:

static REF_STATUS collar(REF_MPI ref_mpi, int argc, char *argv[]) {
  char *input_filename = NULL;
  char *inflate_arg = NULL;
  char inflate_normal[] = "normal";
  char inflate_flat[] = "flat";
  char inflate_radial[] = "radial";
  char *inflate_method = NULL;
  REF_GRID ref_grid = NULL;
  REF_INT nlayers, layer;
  REF_DBL first_thickness, total_thickness, mach, mach_angle_rad;
  REF_DBL alpha_rad = 0.0;
  REF_DBL thickness, total, xshift;
  REF_DBL rate;
  REF_DICT faceids;
  REF_INT pos, opt;
  REF_DBL origin[3];
  REF_BOOL debug = REF_FALSE;
  REF_BOOL extrude_radially = REF_FALSE;
  REF_BOOL on_rails = REF_FALSE;
  REF_BOOL default_export_filename = REF_TRUE;

  pos = REF_EMPTY;
  RXS(ref_args_find(argc, argv, "--debug", &pos), REF_NOT_FOUND,
      "debug search");
  if (REF_EMPTY != pos) {
    debug = REF_TRUE;
    if (ref_mpi_once(ref_mpi)) printf(" --debug %d\n", (int)debug);
  }

  if (argc < 8) {
    if (ref_mpi_once(ref_mpi)) {
      printf("not enough required arguments\n");
    }
    goto shutdown;
  }
  inflate_arg = argv[2];
  input_filename = argv[3];
  nlayers = atoi(argv[4]);
  first_thickness = atof(argv[5]);
  total_thickness = atof(argv[6]);
  mach = atof(argv[7]);

  inflate_method = NULL;
  if (strncmp(inflate_arg, "n", 1) == 0) {
    inflate_method = inflate_normal;
  } else if (strncmp(inflate_arg, "f", 1) == 0) {
    inflate_method = inflate_flat;
    extrude_radially = REF_TRUE;
    on_rails = REF_TRUE;
  } else if (strncmp(inflate_arg, "r", 1) == 0) {
    inflate_method = inflate_radial;
    extrude_radially = REF_TRUE;
  }
  if (NULL == inflate_method) {
    if (ref_mpi_once(ref_mpi)) {
      printf("unable to parse inflate method >%s<\n", inflate_arg);
    }
    goto shutdown;
  }

  if (ref_mpi_once(ref_mpi)) {
    printf("inflation method %s\n", inflate_method);
    printf("number of layers %d\n", nlayers);
    printf("first thickness %f\n", first_thickness);
    printf("total thickness %f\n", total_thickness);
    printf("mach %f\n", mach);
  }

  if (nlayers <= 0 || first_thickness <= 0.0 || total_thickness <= 0.0 ||
      mach <= 1.0) {
    if (ref_mpi_once(ref_mpi)) {
      printf(
          "number of layers and thicknesses must be positive and "
          "Mach supersonic\n");
    }
    goto shutdown;
  }
  mach_angle_rad = asin(1 / mach);
  RSS(ref_inflate_rate(nlayers, first_thickness, total_thickness, &rate),
      "compute rate");

  if (ref_mpi_once(ref_mpi)) {
    printf("layer growth rate %f\n", rate);
    printf("mach angle %f rad %f deg\n", mach_angle_rad,
           ref_math_in_degrees(mach_angle_rad));
  }

  RSS(ref_dict_create(&faceids), "create");

  RXS(ref_args_find(argc, argv, "--fun3d-mapbc", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    const char *mapbc;
    if (pos >= argc - 1) {
      if (ref_mpi_once(ref_mpi)) {
        printf("--fun3d-mapbc requires a filename\n");
      }
      goto shutdown;
    }
    mapbc = argv[pos + 1];
    if (ref_mpi_once(ref_mpi)) {
      printf("reading fun3d bc map %s\n", mapbc);
      RSS(ref_phys_read_mapbc_token(faceids, mapbc, "inflate"),
          "unable to read fun3d formatted mapbc");
    }
  }

  RXS(ref_args_find(argc, argv, "--usm3d-mapbc", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    const char *mapbc;
    const char *family_name;
    REF_INT bc_type;
    if (pos >= argc - 3) {
      if (ref_mpi_once(ref_mpi)) {
        printf("--usm3d-mapbc requires a filename, family, and bc type\n");
      }
      goto shutdown;
    }
    mapbc = argv[pos + 1];
    family_name = argv[pos + 2];
    bc_type = atoi(argv[pos + 3]);
    if (ref_mpi_once(ref_mpi)) {
      printf("reading usm3d bc map %s family %s bc %d\n", mapbc, family_name,
             bc_type);
      RSS(ref_inflate_read_usm3d_mapbc(faceids, mapbc, family_name, bc_type),
          "faceids from mapbc");
    }
  }

  RSS(ref_dict_bcast(faceids, ref_mpi), "bcast");
  if (ref_mpi_once(ref_mpi)) {
    printf("inflating %d faces\n", ref_dict_n(faceids));
  }
  if (ref_dict_n(faceids) <= 0) {
    if (ref_mpi_once(ref_mpi)) {
      printf("no faces to inflate, use --fun3d-mapbc or --usm3d-mapbc\n");
    }
    goto shutdown;
  }

  ref_mpi_stopwatch_start(ref_mpi);

  if (ref_mpi_para(ref_mpi)) {
    if (ref_mpi_once(ref_mpi)) printf("part %s\n", input_filename);
    RSS(ref_part_by_extension(&ref_grid, ref_mpi, input_filename), "part");
    ref_mpi_stopwatch_stop(ref_mpi, "core part");
    RSS(ref_migrate_to_balance(ref_grid), "balance");
    ref_mpi_stopwatch_stop(ref_mpi, "balance core");
    RSS(ref_grid_pack(ref_grid), "pack");
    ref_mpi_stopwatch_stop(ref_mpi, "pack core");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("import %s\n", input_filename);
    RSS(ref_import_by_extension(&ref_grid, ref_mpi, input_filename), "import");
    ref_mpi_stopwatch_stop(ref_mpi, "core import");
  }
  if (ref_mpi_once(ref_mpi))
    printf("  read " REF_GLOB_FMT " vertices\n",
           ref_node_n_global(ref_grid_node(ref_grid)));

  RXS(ref_args_find(argc, argv, "--rotate", &pos), REF_NOT_FOUND,
      "rotate search");
  if (REF_EMPTY != pos) {
    REF_DBL rotate_deg, rotate_rad;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT node;
    REF_DBL x, z;
    if (pos >= argc - 1) THROW("--rotate requires a value");
    rotate_deg = atof(argv[pos + 1]);
    rotate_rad = ref_math_in_radians(rotate_deg);
    if (ref_mpi_once(ref_mpi))
      printf(" --rotate %f deg (%f rad)\n", rotate_deg, rotate_rad);

    each_ref_node_valid_node(ref_node, node) {
      x = ref_node_xyz(ref_node, 0, node);
      z = ref_node_xyz(ref_node, 2, node);
      ref_node_xyz(ref_node, 0, node) =
          x * cos(rotate_rad) - z * sin(rotate_rad);
      ref_node_xyz(ref_node, 2, node) =
          x * sin(rotate_rad) + z * cos(rotate_rad);
    }
  }

  RXS(ref_args_find(argc, argv, "--origin", &pos), REF_NOT_FOUND,
      "origin search");
  if (REF_EMPTY != pos) {
    if (pos >= argc - 3) THROW("--origin requires three values");
    origin[0] = atof(argv[pos + 1]);
    origin[1] = atof(argv[pos + 2]);
    origin[2] = atof(argv[pos + 3]);
    if (ref_mpi_once(ref_mpi))
      printf(" --origin %f %f %f from argument\n", origin[0], origin[1],
             origin[2]);
  } else {
    RSS(ref_inflate_origin(ref_grid, faceids, origin), "orig");
    if (ref_mpi_once(ref_mpi))
      printf(" --origin %f %f %f inferred from z-midpoint\n", origin[0],
             origin[1], origin[2]);
  }

  if (debug) {
    RSS(ref_gather_tec_movie_record_button(ref_grid_gather(ref_grid), REF_TRUE),
        "movie on");
    ref_gather_blocking_frame(ref_grid, "core");
  }

  total = 0.0;
  for (layer = 0; layer < nlayers; layer++) {
    thickness = first_thickness * pow(rate, layer);
    total = total + thickness;
    xshift = thickness / tan(mach_angle_rad);

    if (extrude_radially) {
      RSS(ref_inflate_radially(ref_grid, faceids, origin, thickness,
                               mach_angle_rad, alpha_rad, on_rails, debug),
          "inflate");
    } else {
      RSS(ref_inflate_face(ref_grid, faceids, origin, thickness, xshift),
          "inflate");
    }

    if (ref_mpi_once(ref_mpi))
      printf("layer%5d of%5d thickness %10.3e total %10.3e " REF_GLOB_FMT
             " nodes\n",
             layer + 1, nlayers, thickness, total,
             ref_node_n_global(ref_grid_node(ref_grid)));
  }

  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "inflate");

  if (ref_mpi_once(ref_mpi)) {
    printf("inflated %d faces\n", ref_dict_n(faceids));
    printf("mach %f mach angle %f rad %f deg\n", mach, mach_angle_rad,
           ref_math_in_degrees(mach_angle_rad));
    printf("first thickness %f\n", first_thickness);
    printf("total thickness %f\n", total_thickness);
    printf("rate %f\n", rate);
    printf("layers %d\n", nlayers);
    printf("inflate method %s\n", inflate_method);
  }

  /* export via -x grid.ext and -f final-surf.tec and -q final-vol.plt */
  for (opt = 0; opt < argc - 1; opt++) {
    if (strcmp(argv[opt], "-x") == 0) {
      default_export_filename = REF_FALSE;
      if (ref_mpi_para(ref_mpi)) {
        if (ref_mpi_once(ref_mpi))
          printf("gather " REF_GLOB_FMT " nodes to %s\n",
                 ref_node_n_global(ref_grid_node(ref_grid)), argv[opt + 1]);
        RSS(ref_gather_by_extension(ref_grid, argv[opt + 1]), "gather -x");
        ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "gather");
      } else {
        if (ref_mpi_once(ref_mpi))
          printf("export " REF_GLOB_FMT " nodes to %s\n",
                 ref_node_n_global(ref_grid_node(ref_grid)), argv[opt + 1]);
        RSS(ref_export_by_extension(ref_grid, argv[opt + 1]), "export -x");
        ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "export");
      }
    }
  }

  if (default_export_filename) {
    if (ref_mpi_once(ref_mpi))
      printf("gather " REF_GLOB_FMT " nodes to %s\n",
             ref_node_n_global(ref_grid_node(ref_grid)), "inflated.b8.ugrid");
    RSS(ref_gather_by_extension(ref_grid, "inflated.b8.ugrid"), "gather");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "gather");
  }

  RSS(ref_dict_free(faceids), "free");
  RSS(ref_grid_free(ref_grid), "grid");

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) collar_help(argv[0]);
  RSS(ref_grid_free(ref_grid), "grid");
  return REF_FAILURE;
}